

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTPrinter.cc
# Opt level: O2

int __thiscall
flow::lang::ASTPrinter::accept(ASTPrinter *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int iVar1;
  undefined4 in_register_00000034;
  string local_30;
  
  util::IPAddress::str_abi_cxx11_
            (&local_30,(IPAddress *)(CONCAT44(in_register_00000034,__fd) + 0x40));
  printf<char_const*>(this,"IPAddressExpr: %s\n",local_30._M_dataplus._M_p);
  iVar1 = std::__cxx11::string::~string((string *)&local_30);
  return iVar1;
}

Assistant:

void ASTPrinter::accept(IPAddressExpr& ipaddr) {
  printf("IPAddressExpr: %s\n", ipaddr.value().str().c_str());
}